

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

lua_Integer intarith(lua_State *L,int op,lua_Integer v1,lua_Integer v2)

{
  lua_Integer v2_local;
  lua_Integer v1_local;
  int op_local;
  lua_State *L_local;
  
  switch(op) {
  case 0:
    L_local = (lua_State *)(v1 + v2);
    break;
  case 1:
    L_local = (lua_State *)(v1 - v2);
    break;
  case 2:
    L_local = (lua_State *)(v1 * v2);
    break;
  case 3:
    L_local = (lua_State *)luaV_mod(L,v1,v2);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                  ,0x62,"lua_Integer intarith(lua_State *, int, lua_Integer, lua_Integer)");
  case 6:
    L_local = (lua_State *)luaV_idiv(L,v1,v2);
    break;
  case 7:
    L_local = (lua_State *)(v1 & v2);
    break;
  case 8:
    L_local = (lua_State *)(v1 | v2);
    break;
  case 9:
    L_local = (lua_State *)(v1 ^ v2);
    break;
  case 10:
    L_local = (lua_State *)luaV_shiftl(v1,v2);
    break;
  case 0xb:
    L_local = (lua_State *)luaV_shiftl(v1,-v2);
    break;
  case 0xc:
    L_local = (lua_State *)-v1;
    break;
  case 0xd:
    L_local = (lua_State *)(v1 ^ 0xffffffffffffffff);
  }
  return (lua_Integer)L_local;
}

Assistant:

static lua_Integer intarith (lua_State *L, int op, lua_Integer v1,
                                                   lua_Integer v2) {
  switch (op) {
    case LUA_OPADD: return intop(+, v1, v2);
    case LUA_OPSUB:return intop(-, v1, v2);
    case LUA_OPMUL:return intop(*, v1, v2);
    case LUA_OPMOD: return luaV_mod(L, v1, v2);
    case LUA_OPIDIV: return luaV_idiv(L, v1, v2);
    case LUA_OPBAND: return intop(&, v1, v2);
    case LUA_OPBOR: return intop(|, v1, v2);
    case LUA_OPBXOR: return intop(^, v1, v2);
    case LUA_OPSHL: return luaV_shiftl(v1, v2);
    case LUA_OPSHR: return luaV_shiftl(v1, -v2);
    case LUA_OPUNM: return intop(-, 0, v1);
    case LUA_OPBNOT: return intop(^, ~l_castS2U(0), v1);
    default: lua_assert(0); return 0;
  }
}